

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O2

yo_scene * yo__load_mtl(yo_scene *scene,char *filename)

{
  char cVar1;
  char *str;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  yo_material *pyVar5;
  int s;
  float fVar6;
  yo__vec3f yVar7;
  char *mtok [10];
  char mline [4096];
  
  __stream = fopen(filename,"rt");
  if (__stream == (FILE *)0x0) {
    return (yo_scene *)0x0;
  }
  pyVar5 = (yo_material *)0x0;
  do {
LAB_00164612:
    do {
      pcVar4 = fgets(mline,0x1000,__stream);
      if (pcVar4 == (char *)0x0) {
        fclose(__stream);
        return scene;
      }
      iVar2 = yo__splitws(mline,mtok,10);
      pcVar4 = mtok[0];
    } while (((iVar2 == 0) || (cVar1 = *mtok[0], cVar1 == '#')) || (cVar1 == '/'));
    iVar2 = strcmp(mtok[0],"newmtl");
    str = mtok[1];
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar4,"illum");
      if (iVar2 == 0) {
        iVar2 = atoi(mtok[1]);
        pyVar5->illum = iVar2;
        goto LAB_00164612;
      }
      if (cVar1 != 'd') {
        if (cVar1 == 'N') {
          if ((pcVar4[1] == 's') && (pcVar4[2] == '\0')) {
            fVar6 = yo__parse_float(mtok + 1);
            pyVar5->ns = fVar6;
            goto LAB_00164612;
          }
          if ((pcVar4[1] == 'i') && (pcVar4[2] == '\0')) {
            fVar6 = yo__parse_float(mtok + 1);
            pyVar5->ior = fVar6;
            goto LAB_00164612;
          }
        }
        else if (cVar1 == 'T') {
          if ((pcVar4[1] == 'r') && (pcVar4[2] == '\0')) {
            yVar7 = yo__parse_float3(mtok + 1);
            pyVar5->kt[0] = yVar7.x;
            pyVar5->kt[1] = yVar7.y;
            pyVar5->kt[2] = yVar7.z;
            goto LAB_00164612;
          }
        }
        else if (cVar1 == 'K') {
          if ((pcVar4[1] == 'e') && (pcVar4[2] == '\0')) {
            yVar7 = yo__parse_float3(mtok + 1);
            pyVar5->ke[0] = yVar7.x;
            pyVar5->ke[1] = yVar7.y;
            pyVar5->ke[2] = yVar7.z;
            goto LAB_00164612;
          }
          if ((pcVar4[1] == 'a') && (pcVar4[2] == '\0')) {
            yVar7 = yo__parse_float3(mtok + 1);
            pyVar5->ka[0] = yVar7.x;
            pyVar5->ka[1] = yVar7.y;
            pyVar5->ka[2] = yVar7.z;
            goto LAB_00164612;
          }
          if ((pcVar4[1] == 'd') && (pcVar4[2] == '\0')) {
            yVar7 = yo__parse_float3(mtok + 1);
            pyVar5->kd[0] = yVar7.x;
            pyVar5->kd[1] = yVar7.y;
            pyVar5->kd[2] = yVar7.z;
            goto LAB_00164612;
          }
          if ((pcVar4[1] == 's') && (pcVar4[2] == '\0')) {
            yVar7 = yo__parse_float3(mtok + 1);
            pyVar5->ks[0] = yVar7.x;
            pyVar5->ks[1] = yVar7.y;
            pyVar5->ks[2] = yVar7.z;
            goto LAB_00164612;
          }
          if ((pcVar4[1] == 'r') && (pcVar4[2] == '\0')) {
            yVar7 = yo__parse_float3(mtok + 1);
            pyVar5->kr[0] = yVar7.x;
            pyVar5->kr[1] = yVar7.y;
            pyVar5->kr[2] = yVar7.z;
            goto LAB_00164612;
          }
        }
LAB_0016478f:
        iVar2 = strcmp(pcVar4,"map_Ke");
        if (iVar2 == 0) {
          pcVar4 = yo__strdup(mtok[1]);
          pyVar5->ke_txt = pcVar4;
        }
        else {
          iVar2 = strcmp(pcVar4,"map_Ka");
          if (iVar2 == 0) {
            pcVar4 = yo__strdup(mtok[1]);
            pyVar5->ka_txt = pcVar4;
          }
          else {
            iVar2 = strcmp(pcVar4,"map_Kd");
            if (iVar2 == 0) {
              pcVar4 = yo__strdup(mtok[1]);
              pyVar5->kd_txt = pcVar4;
            }
            else {
              iVar2 = strcmp(pcVar4,"map_Ks");
              if (iVar2 == 0) {
                pcVar4 = yo__strdup(mtok[1]);
                pyVar5->ks_txt = pcVar4;
              }
              else {
                iVar2 = strcmp(pcVar4,"map_Kr");
                if (iVar2 == 0) {
                  pcVar4 = yo__strdup(mtok[1]);
                  pyVar5->kr_txt = pcVar4;
                }
                else {
                  iVar2 = strcmp(pcVar4,"map_Tr");
                  if (iVar2 == 0) {
                    pcVar4 = yo__strdup(mtok[1]);
                    pyVar5->kt_txt = pcVar4;
                  }
                  else {
                    iVar2 = strcmp(pcVar4,"map_Ns");
                    if (iVar2 == 0) {
                      pcVar4 = yo__strdup(mtok[1]);
                      pyVar5->ns_txt = pcVar4;
                    }
                    else {
                      iVar2 = strcmp(pcVar4,"map_d");
                      if (iVar2 == 0) {
                        pcVar4 = yo__strdup(mtok[1]);
                        pyVar5->op_txt = pcVar4;
                      }
                      else {
                        iVar2 = strcmp(pcVar4,"map_Ni");
                        if (iVar2 == 0) {
                          pcVar4 = yo__strdup(mtok[1]);
                          pyVar5->ior_txt = pcVar4;
                        }
                        else {
                          iVar2 = strcmp(pcVar4,"map_bump");
                          if (iVar2 == 0) {
                            pcVar4 = yo__strdup(mtok[1]);
                            pyVar5->bump_txt = pcVar4;
                          }
                          else {
                            iVar2 = strcmp(pcVar4,"map_disp");
                            if (iVar2 == 0) {
                              pcVar4 = yo__strdup(mtok[1]);
                              pyVar5->disp_txt = pcVar4;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_00164612;
      }
      if (pcVar4[1] != '\0') goto LAB_0016478f;
      fVar6 = yo__parse_float(mtok + 1);
      pyVar5->op = fVar6;
      goto LAB_00164612;
    }
    iVar2 = scene->nmaterials;
    iVar3 = 1;
    if (iVar2 == 0) {
LAB_00164a2d:
      pyVar5 = (yo_material *)realloc(scene->materials,(long)iVar3 * 0xe8);
      scene->materials = pyVar5;
      iVar2 = scene->nmaterials;
      s = iVar2 + 1;
      iVar3 = yo__vector_capacity(s);
      memset(pyVar5 + iVar2,0,(long)(iVar3 - iVar2) * 0xe8);
    }
    else {
      s = iVar2 + 1;
      iVar3 = yo__vector_capacity(s);
      iVar2 = yo__vector_capacity(iVar2);
      if (iVar2 < iVar3) goto LAB_00164a2d;
      pyVar5 = scene->materials;
    }
    scene->nmaterials = s;
    pcVar4 = yo__strdup(str);
    pyVar5[(long)s + -1].name = pcVar4;
    pyVar5 = scene->materials + (long)scene->nmaterials + -1;
  } while( true );
}

Assistant:

static inline yo_scene*
yo__load_mtl(yo_scene* scene, const char* filename) {
    FILE* mfile = fopen(filename, "rt");
    if (!mfile) return 0;

    char mline[4096];
    char* mtok[10];
    int mlinenum = 0;

    yo_material* mat = 0;

    // foreach line, splits the line by whitespaces and parses the data
    // directly in the material
    while (fgets(mline, 4096, mfile)) {
        mlinenum += 1;
        int mntok = yo__splitws(mline, mtok, 10);

        if (!mntok) {
            continue;
        } else if (mtok[0][0] == '#' || mtok[0][0] == '/') {
            continue;
        } else if (!strcmp(mtok[0], "newmtl")) {
            yo__add_empty_material(scene, mtok[1]);
            mat = &scene->materials[scene->nmaterials - 1];
        } else if (!strcmp(mtok[0], "illum")) {
            mat->illum = atoi(mtok[1]);
        } else if (!strcmp(mtok[0], "Ke")) {
            *(yo__vec3f*)mat->ke = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ka")) {
            *(yo__vec3f*)mat->ka = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kd")) {
            *(yo__vec3f*)mat->kd = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ks")) {
            *(yo__vec3f*)mat->ks = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kr")) {
            *(yo__vec3f*)mat->kr = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            *(yo__vec3f*)mat->kt = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ns")) {
            mat->ns = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "d")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Ni")) {
            mat->ior = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "map_Ke")) {
            mat->ke_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ka")) {
            mat->ka_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kd")) {
            mat->kd_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ks")) {
            mat->ks_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kr")) {
            mat->kr_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->kt_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ns")) {
            mat->ns_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_d")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ni")) {
            mat->ior_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_bump")) {
            mat->bump_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_disp")) {
            mat->disp_txt = yo__strdup(mtok[1]);
        } else {
            // printf("ignoring value for %s\n", mtok[0]);
        }
    }

    fclose(mfile);

    return scene;
}